

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnOpcode
          (BinaryReaderObjdumpDisassemble *this,Opcode opcode)

{
  Offset OVar1;
  ulong uVar2;
  Opcode OVar3;
  undefined8 in_RAX;
  char *pcVar4;
  size_t sVar5;
  Opcode opcode_local;
  Opcode missing_opcode;
  
  _opcode_local = CONCAT44((Enum)((ulong)in_RAX >> 0x20),opcode.enum_);
  (this->super_BinaryReaderObjdumpBase).current_opcode.enum_ = opcode.enum_;
  if (this->in_function_body == true) {
    if (((this->super_BinaryReaderObjdumpBase).options_)->debug == true) {
      pcVar4 = Opcode::GetName(&opcode_local);
      Stream::Writef(&((this->super_BinaryReaderObjdumpBase).err_stream_._M_t.
                       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                       .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream
                     ,"on_opcode: %#zx: %s\n",
                     ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                      super_BinaryReaderDelegate.state)->offset,pcVar4);
    }
    OVar1 = this->last_opcode_end;
    if ((OVar1 != 0) &&
       (uVar2 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                 super_BinaryReaderDelegate.state)->offset, sVar5 = Opcode::GetLength(&opcode_local)
       , uVar2 < sVar5 + OVar1)) {
      OVar3 = Opcode::FromCode((uint)(this->super_BinaryReaderObjdumpBase).data_
                                     [this->last_opcode_end]);
      _opcode_local = CONCAT44(OVar3.enum_,opcode_local.enum_);
      pcVar4 = Opcode::GetName(&missing_opcode);
      fprintf(_stderr,"error: %#zx missing opcode callback at %#zx (%#02x=%s)\n",
              ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
               super_BinaryReaderDelegate.state)->offset,this->last_opcode_end + 1,
              (ulong)(this->super_BinaryReaderObjdumpBase).data_[this->last_opcode_end],pcVar4);
      return (Result)Error;
    }
    this->current_opcode_offset =
         ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
         state)->offset;
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcode(Opcode opcode) {
  BinaryReaderObjdumpBase::OnOpcode(opcode);
  if (!in_function_body) {
    return Result::Ok;
  }
  if (options_->debug) {
    const char* opcode_name = opcode.GetName();
    err_stream_->Writef("on_opcode: %#" PRIzx ": %s\n", state->offset,
                        opcode_name);
  }

  if (last_opcode_end) {
    // Takes care of cases where opcode's bytes was a non-canonical leb128
    // encoding. In this case, opcode.GetLength() under-reports the length,
    // since it canonicalizes the opcode.
    if (state->offset < last_opcode_end + opcode.GetLength()) {
      Opcode missing_opcode = Opcode::FromCode(data_[last_opcode_end]);
      const char* opcode_name = missing_opcode.GetName();
      fprintf(stderr,
              "error: %#" PRIzx " missing opcode callback at %#" PRIzx
              " (%#02x=%s)\n",
              state->offset, last_opcode_end + 1, data_[last_opcode_end],
              opcode_name);
      return Result::Error;
    }
  }

  current_opcode_offset = state->offset;
  return Result::Ok;
}